

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void __thiscall DriverTest_PutGet_Test::~DriverTest_PutGet_Test(DriverTest_PutGet_Test *this)

{
  ~DriverTest_PutGet_Test
            ((DriverTest_PutGet_Test *)
             &this[-1].super_DriverTest.
              super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(DriverTest, PutGet)
{
    Arbiter a;

    const std::string root(GetParam());
    const std::string path(root + "test.txt");
    const std::string data("Testing path " + path);

    if (a.isLocal(root)) mkdirp(root);

    EXPECT_NO_THROW(a.put(path, data));
    EXPECT_EQ(a.get(path), data);
}